

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

char * cmSHA1_End(SHA_CTX *context,char *buffer)

{
  char *pcVar1;
  int local_44;
  sha_byte **ppsStack_40;
  int i;
  sha_byte *d;
  sha_byte digest [20];
  char *local_18;
  char *buffer_local;
  SHA_CTX *context_local;
  
  ppsStack_40 = &d;
  if (context != (SHA_CTX *)0x0) {
    local_18 = buffer;
    if (buffer == (char *)0x0) {
      memset(context,0,0xd0);
    }
    else {
      cmSHA1_Final((sha_byte *)&d,context);
      for (local_44 = 0; local_44 < 0x14; local_44 = local_44 + 1) {
        pcVar1 = local_18 + 1;
        *local_18 = sha_hex_digits[(int)(*(byte *)ppsStack_40 & 0xf0) >> 4];
        local_18 = local_18 + 2;
        *pcVar1 = sha_hex_digits[(int)(*(byte *)ppsStack_40 & 0xf)];
        ppsStack_40 = (sha_byte **)((long)ppsStack_40 + 1);
      }
      *local_18 = '\0';
    }
    memset(&d,0,0x14);
    return local_18;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cm_sha2.c"
                ,0x301,"char *cmSHA1_End(SHA_CTX *, char *)");
}

Assistant:

char *SHA1_End(SHA_CTX* context, char buffer[]) {
	sha_byte	digest[SHA1_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	if (buffer != (char*)0) {
		SHA1_Final(digest, context);

		for (i = 0; i < SHA1_DIGEST_LENGTH; i++) {
			*buffer++ = sha_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(*context));
	}
	MEMSET_BZERO(digest, SHA1_DIGEST_LENGTH);
	return buffer;
}